

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O2

bool cmAddExecutableCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool global;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  string *psVar9;
  long lVar10;
  cmTarget *pcVar11;
  string *psVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string msg;
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  
  psVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar12 == psVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"called with incorrect number of arguments",
               (allocator<char> *)&srclists);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    this = status->Makefile;
    bVar6 = false;
    global = false;
    bVar1 = false;
    bVar7 = false;
    bVar2 = false;
    bVar5 = false;
    __first._M_current = psVar12;
    while (__first._M_current = __first._M_current + 1, __first._M_current != psVar9) {
      bVar3 = std::operator==(__first._M_current,"WIN32");
      bVar4 = true;
      if (!bVar3) {
        bVar3 = std::operator==(__first._M_current,"MACOSX_BUNDLE");
        bVar4 = bVar5;
        if (bVar3) {
          bVar2 = true;
        }
        else {
          bVar3 = std::operator==(__first._M_current,"EXCLUDE_FROM_ALL");
          if (bVar3) {
            bVar7 = true;
          }
          else {
            bVar3 = std::operator==(__first._M_current,"IMPORTED");
            if (bVar3) {
              bVar6 = true;
            }
            else if ((bVar6) && (bVar3 = std::operator==(__first._M_current,"GLOBAL"), bVar3)) {
              global = true;
            }
            else {
              bVar3 = std::operator==(__first._M_current,"ALIAS");
              if (!bVar3) break;
              bVar1 = true;
            }
          }
        }
      }
      bVar5 = bVar4;
      psVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (bVar6) {
      bVar6 = true;
      if (global == false) {
        global = cmMakefile::IsImportedTargetGlobalScope(this);
      }
    }
    else {
      bVar6 = false;
    }
    bVar4 = cmGeneratorExpression::IsValidTargetName(psVar12);
    if (bVar4) {
      bVar4 = cmGlobalGenerator::IsReservedTarget(psVar12);
      if ((bVar4 || bVar6) || (bVar1)) {
        if (bVar4) goto LAB_001f52a0;
      }
      else {
        lVar10 = std::__cxx11::string::find((char)psVar12,0x3a);
        if (lVar10 != -1) goto LAB_001f52a0;
      }
    }
    else {
LAB_001f52a0:
      bVar4 = cmMakefile::CheckCMP0037(this,psVar12,EXECUTABLE);
      if (!bVar4) {
        return false;
      }
    }
    if (bVar6) {
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"may not be given WIN32 for an IMPORTED target.",
                   (allocator<char> *)&srclists);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                   (allocator<char> *)&srclists);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        if (bVar7 == false) {
          if (bVar1) goto LAB_001f5304;
          pcVar11 = cmMakefile::FindTargetToUse(this,psVar12,false);
          if (pcVar11 == (cmTarget *)0x0) {
            cmMakefile::AddImportedTarget(this,psVar12,EXECUTABLE,global);
            return true;
          }
          msg._M_dataplus._M_p = (pointer)0x1f;
          msg._M_string_length = (size_type)anon_var_dwarf_455877;
          srclists.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar12->_M_dataplus)._M_p;
          srclists.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar12->_M_string_length;
          cmStrCat<char[60]>(&local_80,(cmAlphaNum *)&msg,(cmAlphaNum *)&srclists,
                             (char (*) [60])
                             "\" because another target with the same name already exists.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001f55d7:
          psVar12 = &local_80;
          goto LAB_001f5542;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",
                   (allocator<char> *)&srclists);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else if (bVar1) {
LAB_001f5304:
      bVar5 = cmGeneratorExpression::IsValidTargetName(psVar12);
      if (bVar5) {
        if (bVar7) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                     (allocator<char> *)&srclists);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else if ((bVar6) || (global != false)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"IMPORTED with ALIAS is not allowed.",
                     (allocator<char> *)&srclists);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start == 0x60) {
            bVar6 = cmMakefile::IsAlias(this,__first._M_current);
            if (bVar6) {
              msg._M_dataplus._M_p = (pointer)0x1c;
              msg._M_string_length = (size_type)anon_var_dwarf_455809;
              srclists.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar12->_M_dataplus)._M_p;
              srclists.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar12->_M_string_length;
              cmStrCat<char[19],std::__cxx11::string,char[22]>
                        (&local_80,(cmAlphaNum *)&msg,(cmAlphaNum *)&srclists,
                         (char (*) [19])"\" because target \"",__first._M_current,
                         (char (*) [22])"\" is itself an ALIAS.");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            else {
              pcVar11 = cmMakefile::FindTargetToUse(this,__first._M_current,true);
              if (pcVar11 == (cmTarget *)0x0) {
                msg._M_dataplus._M_p = (pointer)0x1c;
                msg._M_string_length = (size_type)anon_var_dwarf_455809;
                srclists.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar12->_M_dataplus)._M_p;
                srclists.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar12->_M_string_length;
                cmStrCat<char[19],std::__cxx11::string,char[26]>
                          (&local_80,(cmAlphaNum *)&msg,(cmAlphaNum *)&srclists,
                           (char (*) [19])"\" because target \"",__first._M_current,
                           (char (*) [26])"\" does not already exist.");
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              else {
                TVar8 = cmTarget::GetType(pcVar11);
                if (TVar8 == EXECUTABLE) {
                  bVar6 = cmTarget::IsImported(pcVar11);
                  bVar7 = true;
                  if (bVar6) {
                    bVar7 = cmTarget::IsImportedGloballyVisible(pcVar11);
                  }
                  cmMakefile::AddAlias(this,psVar12,__first._M_current,bVar7);
                  return true;
                }
                msg._M_dataplus._M_p = (pointer)0x1c;
                msg._M_string_length = (size_type)anon_var_dwarf_455809;
                srclists.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar12->_M_dataplus)._M_p;
                srclists.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar12->_M_string_length;
                cmStrCat<char[19],std::__cxx11::string,char[24]>
                          (&local_80,(cmAlphaNum *)&msg,(cmAlphaNum *)&srclists,
                           (char (*) [19])"\" because target \"",__first._M_current,
                           (char (*) [24])"\" is not an executable.");
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
            }
            goto LAB_001f55d7;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"ALIAS requires exactly one target argument.",
                     (allocator<char> *)&srclists);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
      }
      else {
        std::operator+(&msg,"Invalid name for ALIAS: ",psVar12);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      msg._M_string_length = 0;
      msg.field_2._M_local_buf[0] = '\0';
      bVar6 = cmMakefile::EnforceUniqueName(this,psVar12,&msg,false);
      if (bVar6) {
        std::__cxx11::string::~string((string *)&msg);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&srclists,
                   __first,(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&msg);
        pcVar11 = cmMakefile::AddExecutable(this,psVar12,&srclists,bVar7);
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"WIN32_EXECUTABLE",(allocator<char> *)&local_80);
          cmTarget::SetProperty(pcVar11,&msg,"ON");
          std::__cxx11::string::~string((string *)&msg);
        }
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"MACOSX_BUNDLE",(allocator<char> *)&local_80);
          cmTarget::SetProperty(pcVar11,&msg,"ON");
          std::__cxx11::string::~string((string *)&msg);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&srclists);
        return true;
      }
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  psVar12 = &msg;
LAB_001f5542:
  std::__cxx11::string::~string((string *)psVar12);
  return false;
}

Assistant:

bool cmAddExecutableCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  auto s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  if (importTarget && !importGlobal) {
    importGlobal = mf.IsImportedTargetGlobalScope();
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(exename, cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      status.SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      status.SetError(
        "may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      status.SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      status.SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      status.SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      status.SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      status.SetError("ALIAS requires exactly one target argument.");
      return false;
    }

    std::string const& aliasedName = *s;
    if (mf.IsAlias(aliasedName)) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" is itself an ALIAS."));
      return false;
    }
    cmTarget* aliasedTarget = mf.FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" does not already exist."));
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" is not an executable."));
      return false;
    }
    mf.AddAlias(exename, aliasedName,
                !aliasedTarget->IsImported() ||
                  aliasedTarget->IsImportedGloballyVisible());
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (mf.FindTargetToUse(exename)) {
      status.SetError(cmStrCat(
        "cannot create imported target \"", exename,
        "\" because another target with the same name already exists."));
      return false;
    }

    // Create the imported target.
    mf.AddImportedTarget(exename, cmStateEnums::EXECUTABLE, importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(exename, msg)) {
      status.SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt = mf.AddExecutable(exename, srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}